

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O2

BOOL Js::JavascriptConversion::ToNumber_FromPrimitive
               (Var aValue,double *pResult,BOOL allowUndefined,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  double dVar6;
  
  bVar3 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x332,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar3) goto LAB_00984e7d;
    *puVar4 = 0;
  }
  bVar3 = TaggedNumber::Is(aValue);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x333,"(!TaggedNumber::Is(aValue))","!TaggedNumber::Is(aValue)");
    if (!bVar3) {
LAB_00984e7d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pRVar5 = VarTo<Js::RecyclableObject>(aValue);
  TVar1 = ((pRVar5->type).ptr)->typeId;
  bVar3 = (allowUndefined != 0 || TVar1 != TypeIds_Undefined) && (int)TVar1 < 7;
  if (bVar3) {
    dVar6 = ToNumber_Full(aValue,scriptContext);
    *pResult = dVar6;
  }
  return (uint)bVar3;
}

Assistant:

BOOL JavascriptConversion::ToNumber_FromPrimitive(Var aValue, double *pResult, BOOL allowUndefined, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ConvNumber_FromPrimitive);
        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));
        Assert(!TaggedNumber::Is(aValue));
        RecyclableObject *obj = VarTo<RecyclableObject>(aValue);

        // NOTE: Don't allow strings, otherwise JIT's float type specialization has to worry about concats
        if (obj->GetTypeId() >= TypeIds_String)
        {
            return false;
        }
        if (!allowUndefined && obj->GetTypeId() == TypeIds_Undefined)
        {
            return false;
        }

        *pResult = ToNumber_Full(aValue, scriptContext);
        return true;
        JIT_HELPER_END(Op_ConvNumber_FromPrimitive);
    }